

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O2

Vec_Ptr_t * If_ManReverseOrder(If_Man_t *p)

{
  int nCap;
  void *Entry;
  void *__ptr;
  uint *puVar1;
  Vec_Ptr_t *p_00;
  uint uVar2;
  int i;
  undefined8 *puVar3;
  
  __ptr = calloc(1,(long)p->nLevelMax * 8 + 8);
  i = 0;
  while( true ) {
    nCap = p->vObjs->nSize;
    if (nCap <= i) {
      p_00 = Vec_PtrAlloc(nCap);
      for (uVar2 = p->nLevelMax; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
        puVar3 = (undefined8 *)((long)__ptr + (ulong)uVar2 * 8);
        while (Entry = (void *)*puVar3, Entry != (void *)0x0) {
          Vec_PtrPush(p_00,Entry);
          puVar3 = (undefined8 *)((long)Entry + 0x40);
        }
      }
      free(__ptr);
      return p_00;
    }
    puVar1 = (uint *)Vec_PtrEntry(p->vObjs,i);
    uVar2 = *puVar1 >> 0xd;
    if ((uint)p->nLevelMax < uVar2) break;
    *(undefined8 *)(puVar1 + 0x10) = *(undefined8 *)((long)__ptr + (ulong)uVar2 * 8);
    *(uint **)((long)__ptr + (ulong)uVar2 * 8) = puVar1;
    i = i + 1;
  }
  __assert_fail("pObj->Level >= 0 && pObj->Level <= (unsigned)p->nLevelMax",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/if/ifUtil.c"
                ,0x176,"Vec_Ptr_t *If_ManReverseOrder(If_Man_t *)");
}

Assistant:

Vec_Ptr_t * If_ManReverseOrder( If_Man_t * p )
{
    Vec_Ptr_t * vOrder;
    If_Obj_t * pObj, ** ppStore;
    int i;
    // allocate place to store the nodes
    ppStore = ABC_ALLOC( If_Obj_t *, p->nLevelMax + 1 );
    memset( ppStore, 0, sizeof(If_Obj_t *) * (p->nLevelMax + 1) );
    // add the nodes
    If_ManForEachObj( p, pObj, i )
    {
        assert( pObj->Level >= 0 && pObj->Level <= (unsigned)p->nLevelMax );
        pObj->pCopy = (char *)ppStore[pObj->Level]; 
        ppStore[pObj->Level] = pObj;
    }
    vOrder = Vec_PtrAlloc( If_ManObjNum(p) );
    for ( i = p->nLevelMax; i >= 0; i-- )
        for ( pObj = ppStore[i]; pObj; pObj = (If_Obj_t *)pObj->pCopy )
            Vec_PtrPush( vOrder, pObj );
    ABC_FREE( ppStore );
    // print the order
//    Vec_PtrForEachEntry( If_Obj_t *, vOrder, pObj, i )
//        Abc_Print( 1, "Obj %2d   Type %d  Level = %d\n", pObj->Id, pObj->Type, pObj->Level );
    return vOrder;
}